

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintTo(char32_t *s,ostream *os)

{
  ostream *os_local;
  char32_t *s_local;
  
  anon_unknown_37::PrintCStringTo<char32_t>(s,os);
  return;
}

Assistant:

void PrintTo(const char32_t* s, ostream* os) { PrintCStringTo(s, os); }